

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

void __thiscall
QTextCursorPrivate::QTextCursorPrivate(QTextCursorPrivate *this,QTextCursorPrivate *rhs)

{
  byte bVar1;
  QTextDocumentPrivate *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  this_00 = rhs->priv;
  this->priv = this_00;
  this->x = rhs->x;
  iVar2 = rhs->anchor;
  iVar3 = rhs->adjusted_anchor;
  iVar4 = rhs->currentCharFormat;
  this->position = rhs->position;
  this->anchor = iVar2;
  this->adjusted_anchor = iVar3;
  this->currentCharFormat = iVar4;
  bVar5 = rhs->field_0x28 & 1;
  bVar1 = this->field_0x28;
  this->field_0x28 = bVar1 & 0xfe | bVar5;
  bVar6 = rhs->field_0x28 & 2;
  this->field_0x28 = bVar1 & 0xfc | bVar5 | bVar6;
  this->field_0x28 = bVar1 & 0xf8 | bVar5 | bVar6 | rhs->field_0x28 & 4;
  if (this_00 != (QTextDocumentPrivate *)0x0) {
    QTextDocumentPrivate::addCursor(this_00,this);
    return;
  }
  return;
}

Assistant:

QTextCursorPrivate::QTextCursorPrivate(const QTextCursorPrivate &rhs)
    : QSharedData(rhs)
{
    position = rhs.position;
    anchor = rhs.anchor;
    adjusted_anchor = rhs.adjusted_anchor;
    priv = rhs.priv;
    x = rhs.x;
    currentCharFormat = rhs.currentCharFormat;
    visualNavigation = rhs.visualNavigation;
    keepPositionOnInsert = rhs.keepPositionOnInsert;
    changed = rhs.changed;
    if (priv != nullptr)
        priv->addCursor(this);
}